

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

array<float,_4> __thiscall pbrt::HairBxDF::ApPDF(HairBxDF *this,Float cosTheta_o)

{
  iterator pvVar1;
  float *pfVar2;
  SampledSpectrum *in_RDI;
  float in_XMM0_Da;
  float v;
  float v_00;
  ulong extraout_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  array<float,_4> aVar12;
  int i;
  SampledSpectrum *as;
  iterator __end1;
  iterator __begin1;
  array<pbrt::SampledSpectrum,_4> *__range1;
  Float sumY;
  array<pbrt::SampledSpectrum,_4> ap;
  SampledSpectrum T;
  Float gamma_t;
  Float cosGamma_t;
  Float sinGamma_t;
  Float etap;
  Float cosTheta_t;
  Float sinTheta_t;
  Float sinTheta_o;
  array<float,_4> apPDF;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  Float FVar13;
  int local_e4;
  iterator local_d0;
  float local_bc;
  array<pbrt::SampledSpectrum,_4> local_a8;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  SampledSpectrum *pSVar14;
  undefined8 in_stack_fffffffffffffff0;
  float local_8 [2];
  undefined1 auVar3 [64];
  undefined1 auVar15 [12];
  undefined8 uVar16;
  undefined1 auVar7 [64];
  
  pSVar14 = in_RDI;
  Sqr<float>(in_XMM0_Da);
  FVar13 = 1.0;
  v = SafeSqrt(0.0);
  v_00 = v / (in_RDI->values).values[1];
  Sqr<float>(v_00);
  local_28 = SafeSqrt(0.0);
  Sqr<float>((in_RDI->values).values[1]);
  Sqr<float>(v);
  local_2c = SafeSqrt(0.0);
  local_2c = local_2c / in_XMM0_Da;
  local_30 = (in_RDI->values).values[0] / local_2c;
  Sqr<float>(local_30);
  auVar10 = ZEXT856(extraout_XMM0_Qb);
  local_34 = SafeSqrt(0.0);
  local_38 = SafeASin(0.0);
  auVar6 = extraout_var;
  SVar11 = SampledSpectrum::operator-(in_RDI);
  auVar7._0_8_ = SVar11.values.values._8_8_;
  auVar7._8_56_ = auVar10;
  auVar3._0_8_ = SVar11.values.values._0_8_;
  auVar3._8_56_ = auVar6;
  local_68 = vmovlpd_avx(auVar3._0_16_);
  local_60 = vmovlpd_avx(auVar7._0_16_);
  auVar10 = (undefined1  [56])0x0;
  auVar6 = ZEXT856(0);
  SVar11 = SampledSpectrum::operator*(in_RDI,FVar13);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar10;
  auVar4._0_8_ = SVar11.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  local_58 = vmovlpd_avx(auVar4._0_16_);
  local_50 = vmovlpd_avx(auVar8._0_16_);
  SVar11 = Exp((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar5._0_8_ = SVar11.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  local_48 = vmovlpd_avx(auVar5._0_16_);
  uStack_40 = vmovlpd_avx(auVar9._0_16_);
  SVar11.values.values[2] = (float)in_stack_fffffffffffffff0;
  SVar11.values.values[3] = SUB84(in_stack_fffffffffffffff0,4);
  SVar11.values.values._0_8_ = pSVar14;
  Ap(in_XMM0_Da,v,v_00,SVar11);
  pstd::array<float,_4>::array((array<float,_4> *)&stack0xfffffffffffffff0);
  local_bc = 0.0;
  local_d0 = pstd::array<pbrt::SampledSpectrum,_4>::begin(&local_a8);
  pvVar1 = pstd::array<pbrt::SampledSpectrum,_4>::end(&local_a8);
  for (; local_d0 != pvVar1; local_d0 = local_d0 + 1) {
    FVar13 = SampledSpectrum::Average
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_bc = FVar13 + local_bc;
  }
  for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
    pstd::array<pbrt::SampledSpectrum,_4>::operator[](&local_a8,(long)local_e4);
    FVar13 = SampledSpectrum::Average
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    in_stack_ffffffffffffff04 = FVar13 / local_bc;
    pfVar2 = pstd::array<float,_4>::operator[]
                       ((array<float,_4> *)&stack0xfffffffffffffff0,(long)local_e4);
    *pfVar2 = in_stack_ffffffffffffff04;
  }
  aVar12.values[0] = (float)in_stack_fffffffffffffff0;
  auVar15._4_4_ = SUB84(in_stack_fffffffffffffff0,4);
  register0x00001240 = local_8[0];
  register0x00001244 = local_8[1];
  return (array<float,_4>)aVar12.values;
}

Assistant:

PBRT_CPU_GPU pstd::array<Float, HairBxDF::pMax + 1> HairBxDF::ApPDF(Float cosTheta_o) const {
    // Initialize array of $A_p$ values for _cosTheta_o_
    Float sinTheta_o = SafeSqrt(1 - Sqr(cosTheta_o));
    // Compute $\cos\,\thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(Sqr(eta) - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);

    // Compute $A_p$ PDF from individual $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF;
    Float sumY = 0;
    for (const SampledSpectrum &as : ap)
        sumY += as.Average();
    for (int i = 0; i <= pMax; ++i)
        apPDF[i] = ap[i].Average() / sumY;

    return apPDF;
}